

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

float_specs
fmt::v7::detail::parse_float_type_spec<fmt::v7::detail::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar2 = (byte)specs->field_0x9 >> 7;
  uVar3 = (uint)bVar2 << 0x14;
  uVar4 = (uint)bVar2 << 0x14;
  cVar1 = specs->type;
  switch(cVar1) {
  case 'A':
    uVar4 = uVar3 | 0x10000;
switchD_002364a2_caseD_61:
    uVar4 = uVar4 | 3;
    break;
  case 'B':
  case 'C':
  case 'D':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
switchD_002364a2_caseD_62:
    error_handler::on_error((error_handler *)specs,"invalid type specifier");
  case 'E':
    uVar3 = 0x10000;
switchD_002364a2_caseD_65:
    uVar4 = (uVar3 & 0xffffe) + (uint)(specs->precision != 0 | bVar2) * 0x100000 + 1;
    break;
  case 'F':
    uVar3 = 0x10000;
switchD_002364a2_caseD_66:
    uVar4 = (uVar3 & 0xffffd) + (uint)(specs->precision != 0 | bVar2) * 0x100000 + 2;
    break;
  case 'G':
    uVar4 = uVar3 | 0x10000;
    break;
  case 'L':
    uVar4 = uVar3 | 0x20000;
    break;
  default:
    switch(cVar1) {
    case 'a':
      goto switchD_002364a2_caseD_61;
    case 'b':
    case 'c':
    case 'd':
      goto switchD_002364a2_caseD_62;
    case 'e':
      goto switchD_002364a2_caseD_65;
    case 'f':
      goto switchD_002364a2_caseD_66;
    case 'g':
      break;
    default:
      if (cVar1 != '\0') goto switchD_002364a2_caseD_62;
      uVar4 = (uint)(0 < specs->precision | bVar2) << 0x14;
    }
  }
  return (float_specs)((ulong)uVar4 << 0x20);
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.showpoint = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.showpoint |= specs.precision > 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}